

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_http_server.c
# Opt level: O2

void test_timer_expires_errors(void)

{
  cio_error cVar1;
  cio_inet_address *arg1;
  uint i;
  long lVar2;
  _func_cio_error_cio_timer_ptr_uint64_t_cio_timer_handler_t_void_ptr *timer_expires_fakes [4];
  cio_http_location target;
  cio_http_server_configuration config;
  cio_http_server server;
  
  for (lVar2 = 0; lVar2 != 4; lVar2 = lVar2 + 1) {
    timer_expires_fakes[0] = expires;
    timer_expires_fakes[1] = expires;
    timer_expires_fakes[2] = expires;
    timer_expires_fakes[3] = expires;
    cio_timer_expires_from_now_fake.custom_fake =
         (_func_cio_error_cio_timer_ptr_uint64_t_cio_timer_handler_t_void_ptr *)0x0;
    timer_expires_fakes[lVar2] = expires_error;
    cio_timer_expires_from_now_fake.custom_fake_seq_len = 4;
    header_complete_fake.custom_fake = callback_write_ok_response;
    cio_timer_expires_from_now_fake.custom_fake_seq = timer_expires_fakes;
    memcpy(&config,&DAT_001199e0,0xb8);
    arg1 = cio_get_inet_address_any4();
    cio_init_inet_socket_address(&config.endpoint,arg1,0x1f90);
    cVar1 = cio_http_server_init(&server,&loop,&config);
    UnityAssertEqualNumber
              (0,(long)cVar1,"Server initialization failed!",0x771,UNITY_DISPLAY_STYLE_INT);
    cVar1 = cio_http_location_init(&target,"/foo",(void *)0x0,alloc_dummy_handler);
    UnityAssertEqualNumber
              (0,(long)cVar1,"Request target initialization failed!",0x774,UNITY_DISPLAY_STYLE_INT);
    cVar1 = cio_http_server_register_location(&server,&target);
    UnityAssertEqualNumber
              (0,(long)cVar1,"Register request target failed!",0x776,UNITY_DISPLAY_STYLE_INT);
    split_request("GET /foo HTTP/1.1\r\n\r\n");
    cVar1 = cio_http_server_serve(&server);
    UnityAssertEqualNumber(0,(long)cVar1,"Serving http failed!",0x77b,UNITY_DISPLAY_STYLE_INT);
    UnityAssertGreaterOrLessOrEqualNumber
              (0,(ulong)serve_error_fake.call_count,UNITY_GREATER_THAN,
               "Serve error callback was called!",0x77c,UNITY_DISPLAY_STYLE_INT);
    UnityAssertEqualNumber
              (1,(ulong)cio_buffered_stream_close_fake.call_count,"buffered stream was not closed!",
               0x77d,UNITY_DISPLAY_STYLE_INT);
    setUp();
  }
  free(&client_socket[-2].impl.close_timer.impl.ev.fd);
  return;
}

Assistant:

static void test_timer_expires_errors(void)
{
	enum cio_error (*timer_expires_fakes[4])(struct cio_timer *timer, uint64_t timeout_ns, cio_timer_handler_t handler, void *handler_context);

	for (unsigned int i = 0; i < ARRAY_SIZE(timer_expires_fakes); i++) {
		timer_expires_fakes[0] = expires;
		timer_expires_fakes[1] = expires;
		timer_expires_fakes[2] = expires;
		timer_expires_fakes[3] = expires;

		timer_expires_fakes[i] = expires_error;

		cio_timer_expires_from_now_fake.custom_fake = NULL;
		SET_CUSTOM_FAKE_SEQ(cio_timer_expires_from_now, timer_expires_fakes, ARRAY_SIZE(timer_expires_fakes))

		header_complete_fake.custom_fake = callback_write_ok_response;

		struct cio_http_server_configuration config = {
		    .on_error = serve_error,
		    .read_header_timeout_ns = header_read_timeout,
		    .read_body_timeout_ns = body_read_timeout,
		    .response_timeout_ns = response_timeout,
		    .close_timeout_ns = 10,
		    .alloc_client = alloc_dummy_client,
		    .free_client = free_dummy_client};

		cio_init_inet_socket_address(&config.endpoint, cio_get_inet_address_any4(), 8080);
		struct cio_http_server server;
		enum cio_error err = cio_http_server_init(&server, &loop, &config);
		TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Server initialization failed!");
		struct cio_http_location target;
		err = cio_http_location_init(&target, "/foo", NULL, alloc_dummy_handler);
		TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Request target initialization failed!");
		err = cio_http_server_register_location(&server, &target);
		TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Register request target failed!");

		split_request("GET /foo HTTP/1.1" CRLF CRLF);

		err = cio_http_server_serve(&server);
		TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Serving http failed!");
		TEST_ASSERT_GREATER_THAN_MESSAGE(0, serve_error_fake.call_count, "Serve error callback was called!");
		TEST_ASSERT_EQUAL_MESSAGE(1, cio_buffered_stream_close_fake.call_count, "buffered stream was not closed!");

		setUp();
	}

	free_dummy_client(client_socket);
}